

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O0

void __thiscall
InterpGCTest_Collect_GlobalCycle_Test::InterpGCTest_Collect_GlobalCycle_Test
          (InterpGCTest_Collect_GlobalCycle_Test *this)

{
  InterpGCTest_Collect_GlobalCycle_Test *this_local;
  
  InterpGCTest::InterpGCTest(&this->super_InterpGCTest);
  (this->super_InterpGCTest).super_InterpTest.super_Test._vptr_Test =
       (_func_int **)&PTR__InterpGCTest_Collect_GlobalCycle_Test_005ade90;
  return;
}

Assistant:

TEST_F(InterpGCTest, Collect_GlobalCycle) {
  auto gt = GlobalType{ValueType::Anyref, Mutability::Var};
  auto g1 = Global::New(store_, gt, Value::Make(Ref::Null));
  auto g2 = Global::New(store_, gt, Value::Make(g1->self()));
  g1->Set(store_, g2->self());

  auto after_new = store_.object_count();
  EXPECT_EQ(before_new + 2, after_new);

  // Remove g1 root, but it's kept alive by g2.
  g1.reset();
  store_.Collect();
  EXPECT_EQ(after_new, store_.object_count());

  // Remove g2 root, now both should be removed.
  g2.reset();
}